

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::ErrorsUtilities::CheckErrorAndLog
          (ErrorsUtilities *this,Context *context,GLuint expected_error,GLchar *function_name,
          GLchar *log)

{
  GLuint GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  bool bVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_208;
  GetNameFunc local_1f8;
  int local_1f0;
  Enum<int,_2UL> local_1e8 [2];
  MessageBuilder local_1c8;
  GLuint local_44;
  long lStack_40;
  GLenum error;
  Functions *gl;
  GLchar *log_local;
  GLchar *function_name_local;
  Context *pCStack_20;
  GLuint expected_error_local;
  Context *context_local;
  ErrorsUtilities *this_local;
  
  gl = (Functions *)log;
  log_local = function_name;
  function_name_local._4_4_ = expected_error;
  pCStack_20 = context;
  context_local = (Context *)this;
  pRVar3 = deqp::Context::getRenderContext(context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = function_name_local._4_4_;
  lStack_40 = CONCAT44(extraout_var,iVar2);
  local_44 = 0;
  local_44 = (**(code **)(lStack_40 + 0x800))();
  bVar5 = GVar1 == local_44;
  if (!bVar5) {
    this_00 = deqp::Context::getTestContext(pCStack_20);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c8,&log_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [18])0x2a707e6);
    EVar6 = glu::getErrorStr(local_44);
    local_1f8 = EVar6.m_getName;
    local_1f0 = EVar6.m_value;
    local_1e8[0].m_getName = local_1f8;
    local_1e8[0].m_value = local_1f0;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1e8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])" but, ");
    EVar6 = glu::getErrorStr(function_name_local._4_4_);
    local_208.m_getName = EVar6.m_getName;
    local_208.m_value = EVar6.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_208);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [18])" was expected if ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&gl);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  }
  return bVar5;
}

Assistant:

bool ErrorsUtilities::CheckErrorAndLog(deqp::Context& context, glw::GLuint expected_error,
									   const glw::GLchar* function_name, const glw::GLchar* log)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Check error. */
	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << function_name << " generated error "
										  << glu::getErrorStr(error) << " but, " << glu::getErrorStr(expected_error)
										  << " was expected if " << log << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}